

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O1

void VW::finish_example(vw *all,example *ec)

{
  bool bVar1;
  int iVar2;
  vw *pvVar3;
  mutex *__mutex;
  
  pvVar3 = all;
  bVar1 = is_ring_example(all,ec);
  if (!bVar1) {
    return;
  }
  empty_example(pvVar3,ec);
  ec->in_use = false;
  object_pool<example,_example_initializer>::return_object(&all->p->example_pool,ec);
  __mutex = &all->p->output_lock;
  iVar2 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
  if (iVar2 == 0) {
    std::condition_variable::notify_one();
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    return;
  }
  std::__throw_system_error(iVar2);
}

Assistant:

void finish_example(vw& all, example& ec)
{
  // only return examples to the pool that are from the pool and not externally allocated
  if (!is_ring_example(all, &ec))
    return;

  clean_example(all, ec, false);

  {
    std::lock_guard<std::mutex> lock(all.p->output_lock);
    all.p->output_done.notify_one();
  }
}